

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdapi_ledger.cpp
# Opt level: O0

ByteData * __thiscall
cfd::api::LedgerApi::Serialize
          (LedgerApi *this,ConfidentialTransactionContext *tx,
          vector<cfd::api::LedgerMetaDataStackItem,_std::allocator<cfd::api::LedgerMetaDataStackItem>_>
          *metadata_stack,bool skip_witness,bool is_authorization)

{
  uint uVar1;
  undefined4 uVar2;
  CfdError error_code;
  uchar *puVar3;
  size_type sVar4;
  undefined8 uVar5;
  vector<cfd::api::LedgerMetaDataStackItem,_std::allocator<cfd::api::LedgerMetaDataStackItem>_>
  *in_RCX;
  ConfidentialTransaction *in_RDX;
  ByteData *in_RDI;
  byte in_R8B;
  byte in_R9B;
  ByteData256 issuance_hash;
  ByteData256 tx_hash;
  uint32_t locktime;
  ConfidentialTxOutReference txout;
  uint32_t index_1;
  uint32_t txout_count;
  LedgerMetaDataStackItem empty_item;
  uint32_t index;
  uint32_t txin_count;
  vector<unsigned_char,_std::allocator<unsigned_char>_> byte_data;
  int32_t version;
  ByteData issuance;
  ByteData temp_data;
  bool has_witness;
  ByteData *data;
  ByteData *in_stack_fffffffffffffa98;
  ConfidentialTxInReference *in_stack_fffffffffffffaa0;
  allocator *paVar6;
  allocator_type *in_stack_fffffffffffffab0;
  string *message;
  undefined4 in_stack_fffffffffffffab8;
  undefined4 in_stack_fffffffffffffabc;
  CfdException *in_stack_fffffffffffffac0;
  byte local_4a9;
  ByteData local_4a8;
  ByteData256 local_490;
  ByteData256 local_478;
  undefined1 local_45a;
  allocator local_459;
  string local_458 [32];
  ByteData local_438;
  CfdError local_41c;
  undefined1 local_418 [276];
  uint local_304;
  ByteData local_300;
  uint32_t local_2e4;
  ByteData *in_stack_fffffffffffffe30;
  undefined1 in_stack_fffffffffffffe3f;
  ConfidentialTxInReference *in_stack_fffffffffffffe40;
  anon_class_1_0_00000001 *in_stack_fffffffffffffe48;
  uint local_104;
  ByteData local_100;
  uint32_t local_e8;
  allocator local_e1;
  string local_e0;
  ByteData local_c0;
  ByteData local_a8;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_88 [8];
  LedgerMetaDataStackItem *in_stack_ffffffffffffff80;
  undefined1 in_stack_ffffffffffffff8f;
  undefined4 in_stack_ffffffffffffff90;
  anon_class_1_0_00000001 *in_stack_ffffffffffffff98;
  ByteData local_40;
  byte local_24;
  byte local_23;
  byte local_22;
  byte local_21;
  vector<cfd::api::LedgerMetaDataStackItem,_std::allocator<cfd::api::LedgerMetaDataStackItem>_>
  *local_20;
  ConfidentialTransaction *local_18;
  
  local_21 = in_R8B & 1;
  local_22 = in_R9B & 1;
  local_20 = in_RCX;
  local_18 = in_RDX;
  uVar1 = (*(in_RDX->super_AbstractTransaction)._vptr_AbstractTransaction[7])();
  local_4a9 = 0;
  if (((uVar1 & 1) != 0) && (local_4a9 = 0, (local_21 & 1) == 0)) {
    local_4a9 = local_22 ^ 0xff;
  }
  local_23 = local_4a9 & 1;
  local_24 = 0;
  core::ByteData::ByteData(in_RDI);
  core::ByteData::ByteData(&local_40);
  core::ByteData::ByteData((ByteData *)&stack0xffffffffffffff98);
  uVar2 = core::AbstractTransaction::GetVersion(&local_18->super_AbstractTransaction);
  std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)0x54aaba);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffac0,
             CONCAT44(in_stack_fffffffffffffabc,in_stack_fffffffffffffab8),in_stack_fffffffffffffab0
            );
  std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)0x54aae3);
  puVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x54aaf5);
  sVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(local_88);
  memcpy(puVar3,&stack0xffffffffffffff94,sVar4);
  core::ByteData::ByteData
            (&local_a8,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_88);
  core::ByteData::Push(in_RDI,&local_a8);
  core::ByteData::~ByteData((ByteData *)0x54ab51);
  if ((local_23 & 1) != 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_e0,"0001",&local_e1);
    core::ByteData::ByteData(&local_c0,&local_e0);
    core::ByteData::Push(in_RDI,&local_c0);
    core::ByteData::~ByteData((ByteData *)0x54abc7);
    std::__cxx11::string::~string((string *)&local_e0);
    std::allocator<char>::~allocator((allocator<char> *)&local_e1);
  }
  local_e8 = core::ConfidentialTransaction::GetTxInCount(local_18);
  core::ByteData::GetVariableInt(&local_100,(ulong)local_e8);
  core::ByteData::Push(in_RDI,&local_100);
  core::ByteData::~ByteData((ByteData *)0x54ad5c);
  for (local_104 = 0; local_104 < local_e8; local_104 = local_104 + 1) {
    core::ConfidentialTransaction::GetTxIn
              ((ConfidentialTxInReference *)&stack0xfffffffffffffd80,local_18,local_104);
    Serialize::anon_class_1_0_00000001::operator()
              (in_stack_fffffffffffffe48,in_stack_fffffffffffffe40,(bool)in_stack_fffffffffffffe3f,
               in_stack_fffffffffffffe30);
    core::ByteData::operator=((ByteData *)in_stack_fffffffffffffaa0,in_stack_fffffffffffffa98);
    core::ByteData::~ByteData((ByteData *)0x54adf3);
    core::ConfidentialTxInReference::~ConfidentialTxInReference(in_stack_fffffffffffffaa0);
    core::ByteData::Push(in_RDI,&local_40);
  }
  LedgerMetaDataStackItem::LedgerMetaDataStackItem
            ((LedgerMetaDataStackItem *)in_stack_fffffffffffffaa0);
  local_2e4 = core::ConfidentialTransaction::GetTxOutCount(local_18);
  core::ByteData::GetVariableInt(&local_300,(ulong)local_2e4);
  core::ByteData::Push(in_RDI,&local_300);
  core::ByteData::~ByteData((ByteData *)0x54aedf);
  for (local_304 = 0; local_304 < local_2e4; local_304 = local_304 + 1) {
    core::ConfidentialTransaction::GetTxOut
              ((ConfidentialTxOutReference *)(local_418 + 0x18),local_18,local_304);
    sVar4 = std::
            vector<cfd::api::LedgerMetaDataStackItem,_std::allocator<cfd::api::LedgerMetaDataStackItem>_>
            ::size(local_20);
    if (local_304 < sVar4) {
      std::
      vector<cfd::api::LedgerMetaDataStackItem,_std::allocator<cfd::api::LedgerMetaDataStackItem>_>
      ::at((vector<cfd::api::LedgerMetaDataStackItem,_std::allocator<cfd::api::LedgerMetaDataStackItem>_>
            *)in_stack_fffffffffffffaa0,(size_type)in_stack_fffffffffffffa98);
    }
    Serialize::anon_class_1_0_00000001::operator()
              (in_stack_ffffffffffffff98,
               (ConfidentialTxOutReference *)CONCAT44(uVar2,in_stack_ffffffffffffff90),
               (bool)in_stack_ffffffffffffff8f,in_stack_ffffffffffffff80);
    in_stack_fffffffffffffac0 = (CfdException *)local_418;
    core::ByteData::operator=((ByteData *)in_stack_fffffffffffffaa0,in_stack_fffffffffffffa98);
    core::ByteData::~ByteData((ByteData *)0x54afce);
    core::ByteData::Push(in_RDI,&local_40);
    core::ConfidentialTxOutReference::~ConfidentialTxOutReference
              ((ConfidentialTxOutReference *)in_stack_fffffffffffffaa0);
  }
  if ((local_23 & 1) == 0) {
    if ((local_22 & 1) != 0) {
      core::HashUtil::Sha256(&local_478,in_RDI);
      core::HashUtil::Sha256(&local_490,(ByteData *)&stack0xffffffffffffff98);
      core::ByteData256::Concat<cfd::core::ByteData256>(&local_4a8,&local_478,&local_490);
      core::ByteData::operator=((ByteData *)in_stack_fffffffffffffaa0,in_stack_fffffffffffffa98);
      core::ByteData::~ByteData((ByteData *)0x54b284);
      core::ByteData256::~ByteData256((ByteData256 *)0x54b291);
      core::ByteData256::~ByteData256((ByteData256 *)0x54b29e);
    }
    local_24 = 1;
    LedgerMetaDataStackItem::~LedgerMetaDataStackItem
              ((LedgerMetaDataStackItem *)in_stack_fffffffffffffaa0);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffab0);
    core::ByteData::~ByteData((ByteData *)0x54b315);
    core::ByteData::~ByteData((ByteData *)0x54b322);
    if ((local_24 & 1) == 0) {
      core::ByteData::~ByteData((ByteData *)0x54b371);
    }
    return in_RDI;
  }
  error_code = core::AbstractTransaction::GetLockTime(&local_18->super_AbstractTransaction);
  message = (string *)local_88;
  local_41c = error_code;
  puVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x54b0a8);
  sVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)message);
  memcpy(puVar3,&local_41c,sVar4);
  core::ByteData::ByteData
            (&local_438,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)message);
  core::ByteData::Push(in_RDI,&local_438);
  core::ByteData::~ByteData((ByteData *)0x54b104);
  local_45a = 1;
  uVar5 = __cxa_allocate_exception(0x30);
  paVar6 = &local_459;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_458,"Witness serialization is not implemented.",paVar6);
  core::CfdException::CfdException(in_stack_fffffffffffffac0,error_code,message);
  local_45a = 0;
  __cxa_throw(uVar5,&core::CfdException::typeinfo,core::CfdException::~CfdException);
}

Assistant:

ByteData LedgerApi::Serialize(
    const ConfidentialTransactionContext& tx,
    const std::vector<LedgerMetaDataStackItem>& metadata_stack,
    bool skip_witness, bool is_authorization) const {
  static auto serialize_input_function =
      [](const ConfidentialTxInReference& txin, bool is_authorization,
         ByteData* issuance) -> ByteData {
    ByteData txin_bytes;
    uint32_t vout = txin.GetVout();
    if (is_authorization) {
      vout &= 0x3fffffff;  // ignore flag
    }
    std::vector<uint8_t> byte_data(sizeof(vout));
    memcpy(byte_data.data(), &vout, byte_data.size());
    txin_bytes = txin.GetTxid().GetData();
    txin_bytes.Push(ByteData(byte_data));
    if (!is_authorization) {
      txin_bytes.Push(txin.GetUnlockingScript().GetData().Serialize());
    }
    uint32_t sequence = txin.GetSequence();
    memcpy(byte_data.data(), &sequence, byte_data.size());
    txin_bytes.Push(ByteData(byte_data));

    if (!issuance || !is_authorization) {
      // do nothing
    } else if (
        txin.GetIssuanceAmount().IsEmpty() &&
        txin.GetInflationKeys().IsEmpty()) {
      issuance->Push(ByteData("00"));
    } else {
      ByteData asset = txin.GetIssuanceAmount().GetData();
      if (asset.IsEmpty()) asset = ByteData("00");
      ByteData token = txin.GetInflationKeys().GetData();
      if (token.IsEmpty()) token = ByteData("00");
      ByteData issuance_bytes;
      issuance_bytes = issuance_bytes.Concat(
          txin.GetBlindingNonce(), txin.GetAssetEntropy(), asset, token);
      issuance->Push(issuance_bytes);
    }
    return txin_bytes;
  };

  static auto serialize_output_function =
      [](const ConfidentialTxOutReference& txout, bool is_authorization,
         const LedgerMetaDataStackItem& metadata) -> ByteData {
    ByteData txout_bytes;
    if (!is_authorization) {
      txout_bytes = txout_bytes.Concat(
          txout.GetAsset().GetData(), txout.GetConfidentialValue().GetData(),
          txout.GetNonce().GetData(),
          txout.GetLockingScript().GetData().Serialize());
    } else if (!txout.GetConfidentialValue().HasBlinding()) {
      txout_bytes = txout_bytes.Concat(
          ByteData(txout.GetAsset().GetHex()),
          ByteData(txout.GetConfidentialValue().GetHex().substr(2)),
          txout.GetLockingScript().GetData().Serialize());
    } else if (!metadata.metadata1.empty()) {
      txout_bytes = txout_bytes.Concat(
          ByteData(metadata.metadata1), ByteData(metadata.metadata2),
          txout.GetLockingScript().GetData().Serialize());
    } else {
      txout_bytes = txout_bytes.Concat(
          ByteData(txout.GetAsset().GetHex()),
          ByteData(txout.GetConfidentialValue().GetHex()),
          txout.GetLockingScript().GetData().Serialize());
    }
    return txout_bytes;
  };

  bool has_witness = (tx.HasWitness() && !skip_witness && !is_authorization);
  ByteData data;
  ByteData temp_data;
  ByteData issuance;

  // version
  int32_t version = tx.GetVersion();
  std::vector<uint8_t> byte_data(sizeof(version));
  memcpy(byte_data.data(), &version, byte_data.size());
  data.Push(ByteData(byte_data));

  // marker & flag (equivalent to bitcoin format)
  if (has_witness) {
    data.Push(ByteData("0001"));
  }

  uint32_t txin_count = tx.GetTxInCount();
  data.Push(ByteData::GetVariableInt(txin_count));
  for (uint32_t index = 0; index < txin_count; ++index) {
    temp_data = serialize_input_function(
        tx.GetTxIn(index), is_authorization, &issuance);
    data.Push(temp_data);
  }

  LedgerMetaDataStackItem empty_item;
  uint32_t txout_count = tx.GetTxOutCount();
  data.Push(ByteData::GetVariableInt(txout_count));
  for (uint32_t index = 0; index < txout_count; ++index) {
    auto txout = tx.GetTxOut(index);
    temp_data = serialize_output_function(
        txout, is_authorization,
        (metadata_stack.size() > index) ? metadata_stack.at(index)
                                        : empty_item);
    data.Push(temp_data);
  }

  if (has_witness) {
    // locktime
    uint32_t locktime = tx.GetLockTime();
    memcpy(byte_data.data(), &locktime, byte_data.size());
    data.Push(ByteData(byte_data));

    // issue rangeproof, token rangeproof, witness, pegin witness
    // surjectionproof, rangeproof
    // FIXME(k-matsuzawa): not implement
    throw CfdException(
        CfdError::kCfdIllegalStateError,
        "Witness serialization is not implemented.");
  }

  if (is_authorization) {
    ByteData256 tx_hash = HashUtil::Sha256(data);
    ByteData256 issuance_hash = HashUtil::Sha256(issuance);
    data = tx_hash.Concat(issuance_hash);
  }

  return data;
}